

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  string *variable;
  string *variable_00;
  int iVar1;
  Option *pOVar2;
  _Head_base<0UL,_uttamarin::LemmaProcessor_*,_false> this;
  BashLemmaProcessor *this_00;
  M4TheoryPreprocessor *this_01;
  initializer_list<std::basic_ostream<char,_std::char_traits<char>_>_*> __l;
  shared_ptr<uttamarin::UtTamarinConfig> config;
  unique_ptr<uttamarin::LemmaJobGenerator,_std::default_delete<uttamarin::LemmaJobGenerator>_>
  lemma_job_generator;
  shared_ptr<uttamarin::OutputWriter> output_writer;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  output_streams;
  CmdParameters parameters;
  App app;
  ofstream output_file_stream;
  App cli;
  _Head_base<0UL,_uttamarin::TheoryPreprocessor_*,_false> local_840;
  _Head_base<0UL,_uttamarin::LemmaProcessor_*,_false> local_838;
  _Head_base<0UL,_uttamarin::LemmaProcessor_*,_false> local_830;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_828;
  int local_81c;
  undefined1 local_818 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  _Alloc_hider local_7f8;
  undefined1 local_7f0 [16];
  shared_ptr<uttamarin::UtTamarinConfig> local_7e0;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_7d0;
  CmdParameters local_7b8;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> local_470;
  App local_458;
  undefined1 local_428 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  ios_base local_330 [264];
  App local_228;
  
  uttamarin::termination::registerSIGINTHandler();
  local_7b8.spthy_file_path._M_dataplus._M_p = (pointer)&local_7b8.spthy_file_path.field_2;
  local_7b8.spthy_file_path._M_string_length = 0;
  local_7b8.spthy_file_path.field_2._M_local_buf[0] = '\0';
  local_7b8.config_file_path._M_dataplus._M_p = (pointer)&local_7b8.config_file_path.field_2;
  local_7b8.config_file_path._M_string_length = 0;
  local_7b8.config_file_path.field_2._M_local_buf[0] = '\0';
  local_7b8.output_file_path._M_dataplus._M_p = (pointer)&local_7b8.output_file_path.field_2;
  local_7b8.output_file_path._M_string_length = 0;
  local_7b8.output_file_path.field_2._M_local_buf[0] = '\0';
  local_7b8.starting_lemma._M_dataplus._M_p = (pointer)&local_7b8.starting_lemma.field_2;
  local_7b8.starting_lemma._M_string_length = 0;
  local_7b8.starting_lemma.field_2._M_local_buf[0] = '\0';
  local_7b8.penetration_lemma._M_dataplus._M_p = (pointer)&local_7b8.penetration_lemma.field_2;
  local_7b8.penetration_lemma._M_string_length = 0;
  local_7b8.penetration_lemma.field_2._M_local_buf[0] = '\0';
  local_7b8.proof_directory._M_dataplus._M_p = (pointer)&local_7b8.proof_directory.field_2;
  local_7b8.proof_directory._M_string_length = 0;
  local_7b8.proof_directory.field_2._M_local_buf[0] = '\0';
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_490,
             "UT Tamarin is a small tool that runs the Tamarin prover on selected\nlemmas and outputs statistics."
             ,"");
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"");
  CLI::App::App(&local_228,&local_490,&local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  local_81c = argc;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_7b8,0,(char *)local_7b8.spthy_file_path._M_string_length,0x13647a);
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"spthy_file","");
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f0,"Path to a .spthy file containing a Tamarin theory.","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_228,&local_4d0,&local_7b8.spthy_file_path,&local_4f0);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Option::check(pOVar2,(Validator *)CLI::ExistingFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  local_7b8.abort_after_failure = true;
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_510,"-a,--abort_after_failure","");
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_530,"Tells the tool to abort if Tamarin fails to prove a lemma.","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&local_228,&local_510,&local_7b8.abort_after_failure,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  local_7b8.is_quiet = false;
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"-q,--quiet","");
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,"Disables the timer on the command line.","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&local_228,&local_550,&local_7b8.is_quiet,&local_570);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_7b8.config_file_path,0,
             (char *)local_7b8.config_file_path._M_string_length,0x13647a);
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"-c,--config_file","");
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b0,"Configuration file for UT Tamarin.","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_228,&local_590,&local_7b8.config_file_path,&local_5b0);
  CLI::Option::check(pOVar2,(Validator *)CLI::ExistingFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  variable = &local_7b8.output_file_path;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)variable,0,(char *)local_7b8.output_file_path._M_string_length,0x13647a);
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"-o,--output_file","");
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f0,"File where UT Tamarin saves its output.","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_228,&local_5d0,variable,&local_5f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  variable_00 = &local_7b8.proof_directory;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)variable_00,0,(char *)local_7b8.proof_directory._M_string_length,0x13647a);
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"-p, --proof_directory","");
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_630,"Directory where the proofs should be stored.","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_228,&local_610,variable_00,&local_630);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_7b8.penetration_lemma,0,
             (char *)local_7b8.penetration_lemma._M_string_length,0x13647a);
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"--penetration_lemma","");
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"Lemma to penetrate.","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_228,&local_650,&local_7b8.penetration_lemma,&local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_7b8.starting_lemma,0,(char *)local_7b8.starting_lemma._M_string_length,
             0x13647a);
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"-s,--start","");
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b0,"Name of the first lemma that should be verified.","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_228,&local_690,&local_7b8.starting_lemma,&local_6b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  local_7b8.timeout = 600;
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"-t,--timeout","");
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f0,
             "Per-lemma timeout in seconds (0 means no timeout, default: 600 seconds).","");
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (&local_228,&local_6d0,&local_7b8.timeout,&local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  CLI::App::parse(&local_228,local_81c,argv);
  local_830._M_head_impl = (LemmaProcessor *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<uttamarin::UtTamarinConfig,std::allocator<uttamarin::UtTamarinConfig>,uttamarin::CmdParameters&>
            (&local_828,(UtTamarinConfig **)&local_830,
             (allocator<uttamarin::UtTamarinConfig> *)local_428,&local_7b8);
  this._M_head_impl = (LemmaProcessor *)operator_new(0x30);
  uttamarin::BashLemmaProcessor::BashLemmaProcessor
            ((BashLemmaProcessor *)this._M_head_impl,(string *)variable_00,local_7b8.timeout);
  if (local_7b8.is_quiet == false) {
    this_00 = (BashLemmaProcessor *)operator_new(0x10);
    local_428 = (undefined1  [8])this._M_head_impl;
    uttamarin::VerboseLemmaProcessor::VerboseLemmaProcessor
              ((VerboseLemmaProcessor *)this_00,
               (unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
                *)local_428);
    this._M_head_impl = (LemmaProcessor *)this_00;
    if (local_428 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_428 + 8))();
    }
  }
  this_01 = (M4TheoryPreprocessor *)operator_new(0x18);
  local_428 = (undefined1  [8])local_830._M_head_impl;
  local_420._M_pi = local_828._M_pi;
  if (local_828._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
    }
  }
  uttamarin::M4TheoryPreprocessor::M4TheoryPreprocessor
            (this_01,(shared_ptr<uttamarin::UtTamarinConfig> *)local_428);
  if (local_420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_420._M_pi);
  }
  local_428 = (undefined1  [8])&std::cout;
  __l._M_len = 1;
  __l._M_array = (iterator)local_428;
  CLI::std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(&local_7d0,__l,(allocator_type *)&local_458);
  std::ofstream::ofstream(local_428);
  iVar1 = std::__cxx11::string::compare((char *)variable);
  if (iVar1 != 0) {
    std::ofstream::open((string *)local_428,(_Ios_Openmode)variable);
    local_458.lemma_processor_._M_t.
    super___uniq_ptr_impl<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
    ._M_t.
    super__Tuple_impl<0UL,_uttamarin::LemmaProcessor_*,_std::default_delete<uttamarin::LemmaProcessor>_>
    .super__Head_base<0UL,_uttamarin::LemmaProcessor_*,_false>._M_head_impl =
         (__uniq_ptr_data<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>,_true,_true>
          )(__uniq_ptr_data<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>,_true,_true>
            )local_428;
    std::vector<std::ostream*,std::allocator<std::ostream*>>::emplace_back<std::ofstream*>
              ((vector<std::ostream*,std::allocator<std::ostream*>> *)&local_7d0,
               (basic_ofstream<char,_std::char_traits<char>_> **)&local_458);
  }
  local_818._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<uttamarin::OutputWriter,std::allocator<uttamarin::OutputWriter>,std::vector<std::ostream*,std::allocator<std::ostream*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_818 + 0x10),
             (OutputWriter **)(local_818 + 8),(allocator<uttamarin::OutputWriter> *)&local_458,
             &local_7d0);
  local_7e0.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_830._M_head_impl;
  local_7e0.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_828._M_pi;
  if (local_828._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
    }
  }
  local_7f0._0_8_ = local_818._8_8_;
  local_7f0._8_8_ = local_808._M_allocated_capacity;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_808._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_808._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_808._M_allocated_capacity + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_808._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_808._M_allocated_capacity + 8) + 1;
    }
  }
  local_840._M_head_impl = (TheoryPreprocessor *)this_01;
  local_838._M_head_impl = this._M_head_impl;
  uttamarin::App::App(&local_458,
                      (unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
                       *)&local_838,
                      (unique_ptr<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
                       *)&local_840,&local_7e0,
                      (shared_ptr<uttamarin::OutputWriter> *)(local_818 + 0x28));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f0._8_8_);
  }
  if (local_7e0.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_7e0.super___shared_ptr<uttamarin::UtTamarinConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((M4TheoryPreprocessor *)local_840._M_head_impl != (M4TheoryPreprocessor *)0x0) {
    (*((TheoryPreprocessor *)&(local_840._M_head_impl)->_vptr_TheoryPreprocessor)->
      _vptr_TheoryPreprocessor[1])();
  }
  local_840._M_head_impl = (TheoryPreprocessor *)0x0;
  if ((BashLemmaProcessor *)local_838._M_head_impl != (BashLemmaProcessor *)0x0) {
    (*((LemmaProcessor *)&(local_838._M_head_impl)->_vptr_LemmaProcessor)->_vptr_LemmaProcessor[1])
              ();
  }
  local_838._M_head_impl = (LemmaProcessor *)0x0;
  local_808._8_8_ = local_830._M_head_impl;
  local_7f8._M_p = (pointer)local_828._M_pi;
  if (local_828._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_828._M_pi)->_M_use_count = (local_828._M_pi)->_M_use_count + 1;
    }
  }
  CreateLemmaJobGenerator
            ((CmdParameters *)local_818,(shared_ptr<uttamarin::UtTamarinConfig> *)&local_7b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f8._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7f8._M_p);
  }
  (**(code **)(*(long *)local_818._0_8_ + 0x10))(&local_470,local_818._0_8_);
  uttamarin::App::RunOnLemmas(&local_458,&local_470);
  CLI::std::vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>::~vector
            ((vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *)&local_470);
  (**(code **)(*(long *)local_818._0_8_ + 8))(local_818._0_8_);
  uttamarin::App::~App(&local_458);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_808._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_808._M_allocated_capacity);
  }
  local_428 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_428 + *(long *)(_VTT + -3)) = _typeinfo;
  std::filebuf::~filebuf((filebuf *)&local_420);
  std::ios_base::~ios_base(local_330);
  if (local_7d0.
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7d0.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7d0.
                          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7d0.
                          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_828._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_828._M_pi);
  }
  CLI::App::~App(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.proof_directory._M_dataplus._M_p != &local_7b8.proof_directory.field_2) {
    operator_delete(local_7b8.proof_directory._M_dataplus._M_p,
                    CONCAT71(local_7b8.proof_directory.field_2._M_allocated_capacity._1_7_,
                             local_7b8.proof_directory.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.penetration_lemma._M_dataplus._M_p != &local_7b8.penetration_lemma.field_2) {
    operator_delete(local_7b8.penetration_lemma._M_dataplus._M_p,
                    CONCAT71(local_7b8.penetration_lemma.field_2._M_allocated_capacity._1_7_,
                             local_7b8.penetration_lemma.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.starting_lemma._M_dataplus._M_p != &local_7b8.starting_lemma.field_2) {
    operator_delete(local_7b8.starting_lemma._M_dataplus._M_p,
                    CONCAT71(local_7b8.starting_lemma.field_2._M_allocated_capacity._1_7_,
                             local_7b8.starting_lemma.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.output_file_path._M_dataplus._M_p != &local_7b8.output_file_path.field_2) {
    operator_delete(local_7b8.output_file_path._M_dataplus._M_p,
                    CONCAT71(local_7b8.output_file_path.field_2._M_allocated_capacity._1_7_,
                             local_7b8.output_file_path.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.config_file_path._M_dataplus._M_p != &local_7b8.config_file_path.field_2) {
    operator_delete(local_7b8.config_file_path._M_dataplus._M_p,
                    CONCAT71(local_7b8.config_file_path.field_2._M_allocated_capacity._1_7_,
                             local_7b8.config_file_path.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.spthy_file_path._M_dataplus._M_p != &local_7b8.spthy_file_path.field_2) {
    operator_delete(local_7b8.spthy_file_path._M_dataplus._M_p,
                    CONCAT71(local_7b8.spthy_file_path.field_2._M_allocated_capacity._1_7_,
                             local_7b8.spthy_file_path.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main (int argc, char *argv[])
{
  termination::registerSIGINTHandler();

  CmdParameters parameters;

  CLI::App cli{
    "UT Tamarin is a small tool that runs the Tamarin prover on selected\n"
    "lemmas and outputs statistics." 
  };

  parameters.spthy_file_path = "";
  cli.add_option("spthy_file", parameters.spthy_file_path,
                 "Path to a .spthy file containing a Tamarin theory."
  )->required()->check(CLI::ExistingFile);

  parameters.abort_after_failure = true;
  cli.add_flag("-a,--abort_after_failure",
               parameters.abort_after_failure,
               "Tells the tool to abort if Tamarin fails to prove a lemma.");

  parameters.is_quiet = false;
  cli.add_flag("-q,--quiet",
               parameters.is_quiet,
               "Disables the timer on the command line.");

  parameters.config_file_path = "";
  cli.add_option("-c,--config_file", parameters.config_file_path,
                 "Configuration file for UT Tamarin."
  )->check(CLI::ExistingFile);

  parameters.output_file_path = "";
  cli.add_option("-o,--output_file", parameters.output_file_path,
                 "File where UT Tamarin saves its output.");

  parameters.proof_directory = "";
  cli.add_option("-p, --proof_directory", parameters.proof_directory,
                 "Directory where the proofs should be stored.");

  parameters.penetration_lemma = "";
  cli.add_option("--penetration_lemma", parameters.penetration_lemma,
                 "Lemma to penetrate.");

  parameters.starting_lemma = "";
  cli.add_option("-s,--start", parameters.starting_lemma,
                 "Name of the first lemma that should be verified.");

  parameters.timeout = 600;
  cli.add_option("-t,--timeout", parameters.timeout,
                 "Per-lemma timeout in seconds "
                 "(0 means no timeout, default: 600 seconds).");

  CLI11_PARSE(cli, argc, argv);

  auto config = std::make_shared<UtTamarinConfig>(parameters);

  std::unique_ptr<LemmaProcessor> lemma_processor =
          std::make_unique<BashLemmaProcessor>(parameters.proof_directory,
                                               parameters.timeout);

  if(!parameters.is_quiet) {
    lemma_processor =
          std::make_unique<VerboseLemmaProcessor>(std::move(lemma_processor));
  }

  auto theory_preprocessor = std::make_unique<M4TheoryPreprocessor>(config);

  std::vector<std::ostream*> output_streams = std::vector{&std::cout};
  std::ofstream output_file_stream;
  if(parameters.output_file_path != "") {
    output_file_stream.open(parameters.output_file_path);
    output_streams.emplace_back(&output_file_stream);
  }
  auto output_writer = std::make_shared<OutputWriter>(output_streams);

  App app (std::move(lemma_processor),
           std::move(theory_preprocessor),
           config,
           output_writer);

  auto lemma_job_generator = CreateLemmaJobGenerator(parameters, config);

  app.RunOnLemmas(lemma_job_generator->GenerateLemmaJobs());

  return 0;
}